

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int DisconnectRazorAHRSx(RAZORAHRS *pRazorAHRS)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((RAZORAHRS *)addrsRazorAHRS[lVar2] == pRazorAHRS) {
      iVar1 = DisconnectRazorAHRS(pRazorAHRS);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsRazorAHRS[lVar2] = (void *)0x0;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectRazorAHRSx(RAZORAHRS* pRazorAHRS)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRazorAHRS[id] != pRazorAHRS)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectRazorAHRS(pRazorAHRS);
	if (res != EXIT_SUCCESS) return res;

	addrsRazorAHRS[id] = NULL;

	return EXIT_SUCCESS;
}